

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

StringReader * __thiscall
phosg::StringReader::subx(StringReader *__return_storage_ptr__,StringReader *this,size_t offset)

{
  out_of_range *this_00;
  size_t offset_local;
  StringReader *this_local;
  
  if (this->length < offset) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    ::std::out_of_range::out_of_range(this_00,"sub-reader begins beyond end of data");
    __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
  }
  StringReader(__return_storage_ptr__,this->data + offset,this->length - offset,0);
  return __return_storage_ptr__;
}

Assistant:

StringReader StringReader::subx(size_t offset) const {
  if (offset > this->length) {
    throw out_of_range("sub-reader begins beyond end of data");
  }
  return StringReader(
      reinterpret_cast<const char*>(this->data) + offset,
      this->length - offset);
}